

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.cpp
# Opt level: O1

LPVOID VIRTUALCommitMemory(CPalThread *pthrCurrent,LPVOID lpAddress,SIZE_T dwSize,
                          DWORD flAllocationType,DWORD flProtect)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  INT IVar5;
  INT __prot;
  BOOL BVar6;
  uint __c;
  int iVar7;
  int iVar8;
  PCMI pInformation;
  LPVOID pvVar9;
  int *piVar10;
  undefined1 *puVar11;
  ulong uVar12;
  ulong uVar13;
  void *__addr;
  ulong Index;
  SIZE_T SVar14;
  SIZE_T nNumberOfBits;
  ulong Index_00;
  uint uVar15;
  ulong local_40;
  uint local_34;
  
  if (lpAddress == (LPVOID)0x0) {
    local_40 = dwSize + 0xfff & 0xfffffffffffff000;
    uVar13 = 0;
  }
  else {
    uVar13 = (ulong)lpAddress & 0xfffffffffffff000;
    local_40 = ((long)lpAddress + dwSize + 0xfff & 0xfffffffffffff000) - uVar13;
  }
  pInformation = VIRTUALFindRegionInformation(uVar13);
  if (pInformation == (PCMI)0x0) {
    pvVar9 = VIRTUALReserveMemory(pthrCurrent,lpAddress,dwSize,flAllocationType,flProtect);
    if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013176c;
    if (pvVar9 == (LPVOID)0x0) {
LAB_00131470:
      bVar3 = false;
      pInformation = (PCMI)0x0;
      bVar2 = false;
    }
    else {
      uVar13 = (ulong)pvVar9 & 0xfffffffffffff000;
      local_40 = ((long)pvVar9 + dwSize + 0xfff & 0xfffffffffffff000) - uVar13;
      pInformation = VIRTUALFindRegionInformation(uVar13);
      if (pInformation == (PCMI)0x0) {
        fprintf(_stderr,"] %s %s:%d","VIRTUALCommitMemory",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                ,0x4af);
        fprintf(_stderr,"Unable to locate the region information.\n");
        piVar10 = __errno_location();
        *piVar10 = 0x54f;
        goto LAB_00131470;
      }
      bVar2 = true;
      bVar3 = true;
    }
    if (!bVar2) {
      return (LPVOID)0x0;
    }
  }
  else {
    bVar3 = false;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    uVar13 = uVar13 - pInformation->startBoundary;
    Index = uVar13 >> 0xc;
    IVar5 = VIRTUALGetAllocationType(Index,pInformation);
    bVar1 = pInformation->pProtectionState[Index];
    __prot = W32toUnixAccessControl(flProtect);
    bVar4 = VIRTUALConvertWinFlags(flProtect);
    if (local_40 >> 0xc <= (pInformation->memSize >> 0xc) - Index) {
      if (0xfff < local_40) {
        __c = (uint)bVar4;
        uVar12 = (local_40 >> 0xc) + Index;
        local_34 = (uint)bVar1;
        do {
          Index_00 = Index + 1;
          SVar14 = 1;
          nNumberOfBits = SVar14;
          iVar7 = IVar5;
          uVar15 = local_34;
          if (Index_00 < uVar12) {
            do {
              iVar7 = VIRTUALGetAllocationType(Index_00,pInformation);
              uVar15 = (uint)pInformation->pProtectionState[Index_00];
              nNumberOfBits = SVar14;
              if ((iVar7 != IVar5) || (local_34 != pInformation->pProtectionState[Index_00])) break;
              SVar14 = SVar14 + 1;
              Index_00 = Index_00 + 1;
              nNumberOfBits = uVar12 - Index;
            } while (Index_00 < uVar12);
          }
          __addr = (void *)(Index * 0x1000 + pInformation->startBoundary);
          local_40 = nNumberOfBits << 0xc;
          if (IVar5 != 0x1000) {
            puVar11 = (undefined1 *)mmap64(__addr,local_40,3,0x32,-1,0);
            if (puVar11 == &DAT_ffffffffffffffff) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013176c;
              piVar10 = __errno_location();
              strerror(*piVar10);
            }
            else {
              VIRTUALSetAllocState(0x1000,Index,nNumberOfBits,pInformation);
              local_34 = 2;
              if (__prot == 3) {
                memset(pInformation->pProtectionState + Index,__c,nNumberOfBits);
              }
            }
            if (puVar11 == &DAT_ffffffffffffffff) goto LAB_00131516;
          }
          if (local_34 != __c) {
            iVar8 = mprotect(__addr,local_40,__prot);
            if (iVar8 == -1) {
              if (PAL_InitializeChakraCoreCalled == false) goto LAB_0013176c;
              piVar10 = __errno_location();
              strerror(*piVar10);
              goto LAB_00131516;
            }
            memset(pInformation->pProtectionState + Index,__c,nNumberOfBits);
          }
          Index = Index_00;
          IVar5 = iVar7;
          local_34 = uVar15;
        } while (Index_00 < uVar12);
      }
      return (LPVOID)((uVar13 & 0xfffffffffffff000) + pInformation->startBoundary);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
LAB_00131516:
      if (bVar3 || (flAllocationType & 0x2000) != 0) {
        munmap((void *)0x0,local_40);
        BVar6 = VIRTUALReleaseMemory(pInformation);
        if (BVar6 != 0) {
          return (LPVOID)0x0;
        }
        fprintf(_stderr,"] %s %s:%d","VIRTUALCommitMemory",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/virtual.cpp"
                ,0x544);
        fprintf(_stderr,"Unable to remove the PCMI entry from the list.\n");
        piVar10 = __errno_location();
        *piVar10 = 0x54f;
      }
      return (LPVOID)0x0;
    }
  }
LAB_0013176c:
  abort();
}

Assistant:

static LPVOID VIRTUALCommitMemory(
                IN CPalThread *pthrCurrent, /* Currently executing thread */
                IN LPVOID lpAddress,        /* Region to reserve or commit */
                IN SIZE_T dwSize,           /* Size of Region */
                IN DWORD flAllocationType,  /* Type of allocation */
                IN DWORD flProtect)         /* Type of access protection */
{
    UINT_PTR StartBoundary      = 0;
    SIZE_T MemSize              = 0;
    PCMI pInformation           = 0;
    LPVOID pRetVal              = NULL;
    BOOL IsLocallyReserved      = FALSE;
    SIZE_T totalPages;
    INT allocationType, curAllocationType;
    INT protectionState, curProtectionState;
    SIZE_T initialRunStart;
    SIZE_T runStart;
    SIZE_T runLength;
    SIZE_T index;
    INT nProtect;
    INT vProtect;

    if ( lpAddress )
    {
        StartBoundary = (UINT_PTR)lpAddress & ~VIRTUAL_PAGE_MASK;
        /* Add the sizes, and round down to the nearest page boundary. */
        MemSize = ( ((UINT_PTR)lpAddress + dwSize + VIRTUAL_PAGE_MASK) & ~VIRTUAL_PAGE_MASK ) -
                  StartBoundary;
    }
    else
    {
        MemSize = ( dwSize + VIRTUAL_PAGE_MASK ) & ~VIRTUAL_PAGE_MASK;
    }

    /* See if we have already reserved this memory. */
    pInformation = VIRTUALFindRegionInformation( StartBoundary );

    if ( !pInformation )
    {
        /* According to the new MSDN docs, if MEM_COMMIT is specified,
        and the memory is not reserved, you reserve and then commit.
        */
        LPVOID pReservedMemory =
                VIRTUALReserveMemory( pthrCurrent, lpAddress, dwSize,
                                      flAllocationType, flProtect );

        TRACE( "Reserve and commit the memory!\n " );

        if ( pReservedMemory )
        {
            /* Re-align the addresses and try again to find the memory. */
            StartBoundary = (UINT_PTR)pReservedMemory & ~VIRTUAL_PAGE_MASK;
            MemSize = ( ((UINT_PTR)pReservedMemory + dwSize + VIRTUAL_PAGE_MASK)
                        & ~VIRTUAL_PAGE_MASK ) - StartBoundary;

            pInformation = VIRTUALFindRegionInformation( StartBoundary );

            if ( !pInformation )
            {
                ASSERT( "Unable to locate the region information.\n" );
                pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
                pRetVal = NULL;
                goto done;
            }
            IsLocallyReserved = TRUE;
        }
        else
        {
            ERROR( "Unable to reserve the memory.\n" );
            /* Don't set last error here, it will already be set. */
            pRetVal = NULL;
            goto done;
        }
    }

    TRACE( "Committing the memory now..\n");

    // Pages that aren't already committed need to be committed. Pages that
    // are committed don't need to be committed, but they might need to have
    // their permissions changed.
    // To get this right, we find runs of pages with similar states and
    // permissions. If a run is not committed, we commit it and then set
    // its permissions. If a run is committed but has different permissions
    // from what we're trying to set, we set its permissions. Finally,
    // if a run is already committed and has the right permissions,
    // we don't need to do anything to it.

    totalPages = MemSize / VIRTUAL_PAGE_SIZE;
    runStart = (StartBoundary - pInformation->startBoundary) /
                VIRTUAL_PAGE_SIZE;   // Page index
    initialRunStart = runStart;
    allocationType = VIRTUALGetAllocationType(runStart, pInformation);
    protectionState = pInformation->pProtectionState[runStart];
    curAllocationType = allocationType;
    curProtectionState = protectionState;
    runLength = 1;
    nProtect = W32toUnixAccessControl(flProtect);
    vProtect = VIRTUALConvertWinFlags(flProtect);

    if (totalPages > pInformation->memSize / VIRTUAL_PAGE_SIZE - runStart)
    {
        ERROR("Trying to commit beyond the end of the region!\n");
        goto error;
    }

    while(runStart < initialRunStart + totalPages)
    {
        // Find the next run of pages
        for(index = runStart + 1; index < initialRunStart + totalPages;
            index++)
        {
            curAllocationType = VIRTUALGetAllocationType(index, pInformation);
            curProtectionState = pInformation->pProtectionState[index];
            if (curAllocationType != allocationType ||
                curProtectionState != protectionState)
            {
                break;
            }
            runLength++;
        }

        StartBoundary = pInformation->startBoundary + runStart * VIRTUAL_PAGE_SIZE;
        MemSize = runLength * VIRTUAL_PAGE_SIZE;
        if (allocationType != MEM_COMMIT)
        {
            // Commit the pages
            void * pRet = MAP_FAILED;
#if MMAP_DOESNOT_ALLOW_REMAP
            if (mprotect((void *) StartBoundary, MemSize, PROT_WRITE | PROT_READ) == 0)
                pRet = (void *)StartBoundary;
#else // MMAP_DOESNOT_ALLOW_REMAP
            pRet = mmap((void *) StartBoundary, MemSize, PROT_WRITE | PROT_READ,
                     MAP_ANON | MAP_FIXED | MAP_PRIVATE, -1, 0);
#endif // MMAP_DOESNOT_ALLOW_REMAP
            if (pRet != MAP_FAILED)
            {
#if MMAP_DOESNOT_ALLOW_REMAP
                SIZE_T i;
                char *temp = (char *) StartBoundary;
                for(i = 0; i < runLength; i++)
                {

                    if (VIRTUALIsPageDirty(runStart + i, pInformation))
                    {
                        // This page is being recommitted after being decommitted,
                        // therefore the memory needs to be cleared
                        memset (temp, 0, VIRTUAL_PAGE_SIZE);
                    }

                    temp += VIRTUAL_PAGE_SIZE;
                }
#endif // MMAP_DOESNOT_ALLOW_REMAP
            }
            else
            {
                ERROR("mmap() failed! Error(%d)=%s\n", errno, strerror(errno));
                goto error;
            }
            VIRTUALSetAllocState(MEM_COMMIT, runStart, runLength, pInformation);
#if MMAP_DOESNOT_ALLOW_REMAP
            VIRTUALSetDirtyPages (0, runStart, runLength, pInformation);
#endif // MMAP_DOESNOT_ALLOW_REMAP

            if (nProtect == (PROT_WRITE | PROT_READ))
            {
                // Handle this case specially so we don't bother
                // mprotect'ing the region.
                memset(pInformation->pProtectionState + runStart,
                       vProtect, runLength);
            }
            protectionState = VIRTUAL_READWRITE;
        }
        if (protectionState != vProtect)
        {
            // Change permissions.
            if (mprotect((void *) StartBoundary, MemSize, nProtect) != -1)
            {
                memset(pInformation->pProtectionState + runStart,
                       vProtect, runLength);
            }
            else
            {
                ERROR("mprotect() failed! Error(%d)=%s\n",
                      errno, strerror(errno));
                goto error;
            }
        }

        runStart = index;
        runLength = 1;
        allocationType = curAllocationType;
        protectionState = curProtectionState;
    }
    pRetVal = (void *) (pInformation->startBoundary +
                        initialRunStart * VIRTUAL_PAGE_SIZE);
    goto done;

error:
    if ( flAllocationType & MEM_RESERVE || IsLocallyReserved )
    {
#if (MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP)
        mmap(pRetVal, MemSize, PROT_NONE, MAP_FIXED | MAP_PRIVATE,
             gBackingFile, (char *) pRetVal - (char *) gBackingBaseAddress);
#else   // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
        munmap( pRetVal, MemSize );
#endif  // MMAP_IGNORES_HINT && !MMAP_DOESNOT_ALLOW_REMAP
        if ( VIRTUALReleaseMemory( pInformation ) == FALSE )
        {
            ASSERT( "Unable to remove the PCMI entry from the list.\n" );
            pthrCurrent->SetLastError( ERROR_INTERNAL_ERROR );
            pRetVal = NULL;
            goto done;
        }
        pInformation = NULL;
        pRetVal = NULL;
    }

done:

    return pRetVal;
}